

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poledf.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  ifstream *input_stream;
  allocator local_705;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  string local_6f8;
  undefined8 local_6d8;
  undefined8 local_6d0;
  double signal;
  Buffer buffer;
  AllPoleDigitalFilter filter;
  vector<double,_std::allocator<double>_> filter_coefficients;
  ostringstream error_message_7;
  InputSourcePreprocessingForFilterGain preprocessing;
  InputSourceFromStream input_source;
  ifstream ifs2;
  byte abStack_4a0 [488];
  InputSourceInterpolation interpolation;
  ifstream ifs1;
  byte abStack_218 [488];
  
  num_filter_order = 0x19;
  frame_period = 100;
  interpolation_period = 1;
  local_6d0 = 0;
  local_6d8 = 0;
  while( true ) {
    iVar6 = ya_getopt_long(argc,argv,"m:p:i:tkh",(option *)0x0,(int *)0x0);
    if (0xc < iVar6 - 0x68U) break;
    switch(iVar6) {
    case 0x68:
      anon_unknown.dwarf_2af9::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&interpolation_period);
      bVar3 = interpolation_period < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar4 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -i option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00103922;
      }
      break;
    default:
      goto switchD_0010367d_caseD_6a;
    case 0x6b:
      local_6d0 = 3;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&num_filter_order);
      bVar3 = num_filter_order < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar4 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00103922;
      }
      break;
    case 0x70:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs1,&frame_period);
      bVar4 = frame_period < 1;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"The argument for the -p option must be a positive integer"
                       );
        std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_00103922:
        std::__cxx11::string::~string((string *)&ifs2);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
        return 1;
      }
      break;
    case 0x74:
      local_6d8 = CONCAT71((int7)((ulong)((long)&switchD_0010367d::switchdataD_0010c004 +
                                         (long)(int)(&switchD_0010367d::switchdataD_0010c004)
                                                    [iVar6 - 0x68U]) >> 8),1);
    }
  }
  if (iVar6 != -1) {
switchD_0010367d_caseD_6a:
    anon_unknown.dwarf_2af9::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  if (frame_period / 2 < interpolation_period) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    poVar7 = std::operator<<((ostream *)&ifs1,
                             "Interpolation period must be equal to or less than half ");
    std::operator<<(poVar7,"frame period");
    std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
    goto LAB_00103922;
  }
  lVar8 = (long)argc;
  if (argc - ya_optind == 1) {
    lVar2 = lVar8 + -1;
    pcVar9 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      std::operator<<((ostream *)&ifs1,"Just two input files, afile and infile, are required");
      std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      goto LAB_00103922;
    }
    lVar2 = lVar8 + -2;
    pcVar9 = argv[lVar8 + -1];
  }
  pcVar1 = argv[lVar2];
  bVar4 = sptk::SetBinaryMode();
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&ifs2,"poledf",(allocator *)&error_message_7);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
    goto LAB_00103922;
  }
  std::ifstream::ifstream(&ifs1);
  std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
  if ((abStack_218[*(long *)(_ifs1 + -0x18)] & 5) == 0) {
    input_stream = &ifs2;
    std::ifstream::ifstream(input_stream);
    if ((pcVar9 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar9),
       (abStack_4a0[*(long *)(_ifs2 + -0x18)] & 5) == 0)) {
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      lVar8 = (long)num_filter_order;
      std::vector<double,_std::allocator<double>_>::vector
                (&filter_coefficients,lVar8 + 1U,(allocator_type *)&error_message_7);
      sptk::InputSourceFromStream::InputSourceFromStream
                (&input_source,false,(int)(lVar8 + 1U),(istream *)&ifs1);
      iVar6 = 1;
      sptk::InputSourceInterpolation::InputSourceInterpolation
                (&interpolation,frame_period,interpolation_period,true,
                 &input_source.super_InputSourceInterface);
      sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
                (&preprocessing,(FilterGainType)local_6d0,&interpolation.super_InputSourceInterface)
      ;
      if (preprocessing.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        std::operator<<((ostream *)&error_message_7,"Failed to initialize InputSource");
        std::__cxx11::string::string((string *)&buffer,"poledf",(allocator *)&local_6f8);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
      }
      else {
        sptk::AllPoleDigitalFilter::AllPoleDigitalFilter
                  (&filter,num_filter_order,(bool)((byte)local_6d8 & 1));
        buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00111ba0;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (filter.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,"Failed to initialize AllPoleDigitalFilter");
          std::__cxx11::string::string((string *)&local_6f8,"poledf",(allocator *)&signal);
          sptk::PrintErrorMessage(&local_6f8,&error_message_7);
        }
        else {
          do {
            bVar4 = sptk::ReadStream<double>(&signal,(istream *)input_stream);
            if (!bVar4) {
              iVar6 = 0;
              goto LAB_00103eb1;
            }
            bVar4 = sptk::InputSourcePreprocessingForFilterGain::Get
                              (&preprocessing,
                               (vector<double,_std::allocator<double>_> *)&filter_coefficients);
            if (!bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
              std::operator<<((ostream *)&error_message_7,"Cannot get filter coefficients");
              std::__cxx11::string::string((string *)&local_6f8,"poledf",&local_705);
              sptk::PrintErrorMessage(&local_6f8,&error_message_7);
              goto LAB_00103e97;
            }
            bVar4 = sptk::AllPoleDigitalFilter::Run(&filter,&filter_coefficients,&signal,&buffer);
            if (!bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
              std::operator<<((ostream *)&error_message_7,"Failed to apply all-pole digital filter")
              ;
              std::__cxx11::string::string((string *)&local_6f8,"poledf",&local_705);
              sptk::PrintErrorMessage(&local_6f8,&error_message_7);
              goto LAB_00103e97;
            }
            bVar4 = sptk::WriteStream<double>(signal,(ostream *)&std::cout);
          } while (bVar4);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,"Failed to write a filter output");
          std::__cxx11::string::string((string *)&local_6f8,"poledf",&local_705);
          sptk::PrintErrorMessage(&local_6f8,&error_message_7);
        }
LAB_00103e97:
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar6 = 1;
LAB_00103eb1:
        sptk::AllPoleDigitalFilter::Buffer::~Buffer(&buffer);
      }
      sptk::InputSourceInterpolation::~InputSourceInterpolation(&interpolation);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&filter_coefficients.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
      poVar7 = std::operator<<((ostream *)&error_message_7,"Cannot open file ");
      std::operator<<(poVar7,pcVar9);
      std::__cxx11::string::string((string *)&interpolation,"poledf",(allocator *)&input_source);
      sptk::PrintErrorMessage((string *)&interpolation,&error_message_7);
      std::__cxx11::string::~string((string *)&interpolation);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
      iVar6 = 1;
    }
    std::ifstream::~ifstream(&ifs2);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
    poVar7 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
    std::operator<<(poVar7,pcVar1);
    std::__cxx11::string::string((string *)&error_message_7,"poledf",(allocator *)&interpolation);
    sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs2);
    std::__cxx11::string::~string((string *)&error_message_7);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
    iVar6 = 1;
  }
  std::ifstream::~ifstream(&ifs1);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  bool transposition_flag(kDefaultTranspositionFlag);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:tkh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        transposition_flag = true;
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, afile and infile, are required";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  const sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type(
      gain_flag
          ? sptk::InputSourcePreprocessingForFilterGain::FilterGainType::kLinear
          : sptk::InputSourcePreprocessingForFilterGain::FilterGainType::
                kUnity);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  sptk::AllPoleDigitalFilter filter(num_filter_order, transposition_flag);
  sptk::AllPoleDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AllPoleDigitalFilter";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply all-pole digital filter";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }
  }

  return 0;
}